

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

SRes LzmaDecode(Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,Byte *propData,uint propSize,
               ELzmaFinishMode finishMode,ELzmaStatus *status,ISzAlloc *alloc)

{
  ulong uVar1;
  SRes SVar2;
  ulong *in_RCX;
  SizeT *in_RSI;
  undefined8 in_RDI;
  ELzmaFinishMode finishMode_00;
  int __result__;
  SizeT inSize;
  SizeT outSize;
  SRes res;
  CLzmaDec p;
  ISzAlloc *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  CLzmaDec *p_00;
  uint in_stack_ffffffffffffff3c;
  Byte *in_stack_ffffffffffffff40;
  CLzmaDec *in_stack_ffffffffffffff48;
  ELzmaStatus *status_00;
  SizeT *in_stack_ffffffffffffff60;
  Byte *in_stack_ffffffffffffff68;
  SizeT in_stack_ffffffffffffff70;
  SRes local_4;
  
  finishMode_00 = (ELzmaFinishMode)((ulong)in_RDI >> 0x20);
  p_00 = (CLzmaDec *)*in_RSI;
  uVar1 = *in_RCX;
  *in_RCX = 0;
  *in_RSI = 0;
  *(undefined4 *)inSize = 0;
  if (uVar1 < 5) {
    local_4 = 6;
  }
  else {
    status_00 = (ELzmaStatus *)0x0;
    local_4 = LzmaDec_AllocateProbs
                        (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff3c,(ISzAlloc *)p_00);
    if (local_4 == 0) {
      LzmaDec_Init((CLzmaDec *)0x89a931);
      *in_RCX = uVar1;
      SVar2 = LzmaDec_DecodeToDic(p_00,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                  in_stack_ffffffffffffff60,finishMode_00,status_00);
      *in_RSI = in_stack_ffffffffffffff70;
      if ((SVar2 == 0) && (*(int *)inSize == 3)) {
        SVar2 = 6;
      }
      LzmaDec_FreeProbs((CLzmaDec *)CONCAT44(local_4,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
      local_4 = SVar2;
    }
  }
  return local_4;
}

Assistant:

SRes LzmaDecode(Byte *dest, SizeT *destLen, const Byte *src, SizeT *srcLen,
    const Byte *propData, unsigned propSize, ELzmaFinishMode finishMode,
    ELzmaStatus *status, ISzAlloc *alloc)
{
  CLzmaDec p;
  SRes res;
  SizeT outSize = *destLen, inSize = *srcLen;
  *destLen = *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  if (inSize < RC_INIT_SIZE)
    return SZ_ERROR_INPUT_EOF;
  LzmaDec_Construct(&p);
  RINOK(LzmaDec_AllocateProbs(&p, propData, propSize, alloc));
  p.dic = dest;
  p.dicBufSize = outSize;
  LzmaDec_Init(&p);
  *srcLen = inSize;
  res = LzmaDec_DecodeToDic(&p, outSize, src, srcLen, finishMode, status);
  *destLen = p.dicPos;
  if (res == SZ_OK && *status == LZMA_STATUS_NEEDS_MORE_INPUT)
    res = SZ_ERROR_INPUT_EOF;
  LzmaDec_FreeProbs(&p, alloc);
  return res;
}